

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_view_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1,size_t nb1,size_t offset)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  ggml_tensor *in_RSI;
  size_t in_R8;
  ggml_tensor *result;
  int ne [4];
  void *in_stack_00000120;
  int *in_stack_00000128;
  int in_stack_00000130;
  ggml_type in_stack_00000134;
  ggml_context *in_stack_00000138;
  
  if (in_RSI->grad != (ggml_tensor *)0x0) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf24,
            "false");
    abort();
  }
  pgVar1 = ggml_new_tensor_impl
                     (in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_00000128,
                      in_stack_00000120);
  pgVar1->nb[1] = in_R8;
  pgVar1->nb[2] = pgVar1->nb[1] * (long)in_ECX;
  pgVar1->nb[3] = pgVar1->nb[2];
  pgVar1->op = GGML_OP_VIEW;
  pgVar1->grad = (ggml_tensor *)0x0;
  pgVar1->src0 = in_RSI;
  pgVar1->src1 = (ggml_tensor *)0x0;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_view_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1,
        size_t                nb1,
        size_t                offset) {
    if (a->grad) {
        GGML_ASSERT(false); // gradient propagation is not supported
    }

    const int ne[GGML_MAX_DIMS] = { ne0, ne1, 1, 1 };

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, (char *) a->data + offset);

    result->nb[1] = nb1;
    result->nb[2] = result->nb[1]*ne1;
    result->nb[3] = result->nb[2];

    result->op   = GGML_OP_VIEW;
    result->grad = NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the offset here?

    return result;
}